

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_f2c_engine.cpp
# Opt level: O0

void adios2_begin_step_f2c_
               (adios2_engine **engine,int *step_mode,float *timeout_seconds,int *status,int *ierr)

{
  int iVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  int *in_R8;
  adios2_step_status statusC;
  undefined4 local_2c;
  int *local_28;
  undefined4 *local_20;
  
  *in_RCX = 0xffffffff;
  local_28 = in_R8;
  local_20 = in_RCX;
  iVar1 = adios2_begin_step(*in_RDX,*in_RDI,*in_RSI,&local_2c);
  *local_28 = iVar1;
  if (*local_28 == 0) {
    *local_20 = local_2c;
  }
  return;
}

Assistant:

void FC_GLOBAL(adios2_begin_step_f2c,
               ADIOS2_BEGIN_STEP_F2C)(adios2_engine **engine, const int *step_mode,
                                      const float *timeout_seconds, int *status, int *ierr)
{
    *status = -1;
    adios2_step_status statusC;

    *ierr = static_cast<int>(adios2_begin_step(*engine, static_cast<adios2_step_mode>(*step_mode),
                                               *timeout_seconds, &statusC));

    if (*ierr == static_cast<int>(adios2_error_none))
    {
        *status = static_cast<int>(statusC);
    }
}